

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

boolean passes_bars(permonst *mptr)

{
  boolean bVar1;
  byte local_12;
  byte local_11;
  permonst *mptr_local;
  
  local_11 = 1;
  if (((((mptr->mflags1 & 8) == 0) && (local_11 = 1, (mptr->mflags1 & 4) == 0)) &&
      (local_11 = 1, mptr->mlet != '\x16')) &&
     ((local_11 = 1, mptr != mons + 0x9f && (local_11 = 1, mptr->msize != '\0')))) {
    bVar1 = dmgtype(mptr,5);
    local_11 = 1;
    if (bVar1 == '\0') {
      local_12 = 0;
      if ((mptr->mflags1 & 0x80000) != 0) {
        local_12 = 2 < mptr->msize ^ 0xff;
      }
      local_11 = local_12;
    }
  }
  return local_11 & 1;
}

Assistant:

boolean passes_bars(const struct permonst *mptr)
{
    return (boolean) (passes_walls(mptr) || amorphous(mptr) ||
		      is_whirly(mptr) || verysmall(mptr) ||
		      dmgtype(mptr, AD_DISN) ||
		      (slithy(mptr) && !bigmonst(mptr)));
}